

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

bool __thiscall
Fossilize::ZipDatabase::read_entry
          (ZipDatabase *this,ResourceTag tag,Hash hash,size_t *blob_size,void *blob,
          PayloadReadFlags flags)

{
  ulong uVar1;
  bool bVar2;
  mz_bool mVar3;
  LogLevel LVar4;
  _Hash_node_base *p_Var5;
  ulong uVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  
  if ((flags & 1) == 0) {
    if (this->alive != true) {
      return false;
    }
    if (this->mode != ReadOnly) {
      return false;
    }
    uVar1 = this->seen_blobs[tag]._M_h._M_bucket_count;
    uVar6 = hash % uVar1;
    p_Var7 = this->seen_blobs[tag]._M_h._M_buckets[uVar6];
    p_Var8 = (__node_base_ptr)0x0;
    if ((p_Var7 != (__node_base_ptr)0x0) &&
       (p_Var5 = p_Var7->_M_nxt, p_Var8 = p_Var7,
       p_Var7->_M_nxt[1]._M_nxt != (_Hash_node_base *)hash)) {
      while (p_Var7 = p_Var5, p_Var5 = p_Var7->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
        p_Var8 = (__node_base_ptr)0x0;
        if (((ulong)p_Var5[1]._M_nxt % uVar1 != uVar6) ||
           (p_Var8 = p_Var7, p_Var5[1]._M_nxt == (_Hash_node_base *)hash)) goto LAB_0014761a;
      }
      p_Var8 = (__node_base_ptr)0x0;
    }
LAB_0014761a:
    if (p_Var8 == (__node_base_ptr)0x0) {
      p_Var5 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var5 = p_Var8->_M_nxt;
    }
    if (blob_size == (size_t *)0x0) {
      return false;
    }
    if (p_Var5 == (_Hash_node_base *)0x0) {
      return false;
    }
    if (blob == (void *)0x0) {
      *blob_size = (size_t)p_Var5[3]._M_nxt;
      return true;
    }
    if (p_Var5[3]._M_nxt <= (_Hash_node_base *)*blob_size) {
      *blob_size = (size_t)p_Var5[3]._M_nxt;
      mVar3 = mz_zip_reader_extract_to_mem
                        (&this->mz,*(mz_uint *)&p_Var5[2]._M_nxt,blob,(size_t)p_Var5[3]._M_nxt,0);
      if (mVar3 != 0) {
        return true;
      }
      LVar4 = get_thread_log_level();
      if ((int)LVar4 < 3) {
        bVar2 = Internal::log_thread_callback(LOG_ERROR,"Failed to extract blob.\n");
        if (bVar2) {
          return false;
        }
        read_entry();
      }
    }
  }
  return false;
}

Assistant:

bool read_entry(ResourceTag tag, Hash hash, size_t *blob_size, void *blob, PayloadReadFlags flags) override
	{
		if ((flags & PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT) != 0)
			return false;

		if (!alive || mode != DatabaseMode::ReadOnly)
			return false;

		auto itr = seen_blobs[tag].find(hash);
		if (itr == end(seen_blobs[tag]))
			return false;

		if (!blob_size)
			return false;

		if (blob && *blob_size < itr->second.size)
			return false;
		*blob_size = itr->second.size;

		if (blob)
		{
			if (!mz_zip_reader_extract_to_mem(&mz, itr->second.index, blob, itr->second.size, 0))
			{
				LOGE_LEVEL("Failed to extract blob.\n");
				return false;
			}
		}

		return true;
	}